

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable(Impl *this,BindlessInfo *info)

{
  ComponentType CVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  RawType RVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Dim DVar8;
  Id sizeId;
  Id IVar9;
  pointer pBVar10;
  LoggingCallback p_Var11;
  void *pvVar12;
  Builder *pBVar13;
  Builder *this_00;
  Id local_2290;
  ResourceMeta local_2228;
  mapped_type *local_21d8;
  mapped_type *meta;
  iterator local_21c8;
  undefined8 local_21c0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_21b8;
  uint local_21a0;
  uint local_219c;
  uint num_elements;
  uint element_size;
  uint vecsize;
  uint bits_2;
  RawType raw_type_2;
  Id sampled_type_id_1;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1170;
  uint local_1150;
  RawType local_114c;
  uint bits_1;
  RawType raw_type_1;
  RawType *local_1140;
  undefined8 local_1138;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1130;
  RawType local_1118;
  Id local_1114;
  Id runtime_array_type_id;
  Id uvec2_type;
  Id uint_type;
  Id sampled_type_id;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_f8;
  ThreadLocalAllocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_d0;
  uint local_ac;
  RawType local_a8;
  uint bits;
  RawType raw_type;
  StorageClass local_80;
  Id local_7c;
  StorageClass storage;
  Id type_id;
  BindlessResource resource;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  local_48;
  BindlessResource *local_40;
  BindlessResource *local_38;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  local_30;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  local_28;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  itr;
  BindlessInfo *info_local;
  Impl *this_local;
  
  itr._M_current = (BindlessResource *)info;
  local_30._M_current =
       (BindlessResource *)
       std::
       vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ::begin(&this->bindless_resources);
  local_38 = (BindlessResource *)
             std::
             vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
             ::end(&this->bindless_resources);
  local_40 = itr._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::BindlessResource*,std::vector<dxil_spv::Converter::Impl::BindlessResource,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>>>,dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                       (local_30,(__normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
                                  )local_38,itr._M_current);
  local_48._M_current =
       (BindlessResource *)
       std::
       vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ::end(&this->bindless_resources);
  bVar4 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar4) {
    pBVar10 = __gnu_cxx::
              __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
              ::operator->(&local_28);
    this_local._4_4_ = pBVar10->var_id;
  }
  else {
    resource.info.desc_set = 0;
    resource.info._24_4_ = ((itr._M_current)->info).binding;
    storage._0_1_ = ((itr._M_current)->info).type;
    storage._1_1_ = ((itr._M_current)->info).component;
    storage._2_2_ = *(undefined2 *)&((itr._M_current)->info).field_0x2;
    unique0x10000c36 = ((itr._M_current)->info).raw_vecsize;
    resource.info.type = ((itr._M_current)->info).kind;
    resource.info.component = ((itr._M_current)->info).field_0x9;
    resource.info._2_2_ = *(undefined2 *)&((itr._M_current)->info).field_0xa;
    resource.info.raw_vecsize = ((itr._M_current)->info).format;
    resource.info._8_8_ = *(undefined8 *)&((itr._M_current)->info).descriptor_type;
    resource.info._16_8_ = *(undefined8 *)&((itr._M_current)->info).offsets;
    local_7c = 0;
    local_80 = 0x7fffffff;
    switch(((itr._M_current)->info).type) {
    case SRV:
      if (((itr._M_current)->info).kind == RTAccelerationStructure) {
        if (((itr._M_current)->info).descriptor_type == SSBO) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&raw_type,"RTASHeap",(ThreadLocalAllocator<char> *)((long)&bits + 3));
          local_7c = build_ssbo_runtime_array_type(this,Integer,0x20,2,1,(String *)&raw_type);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                         *)&raw_type);
          local_80 = StorageClassStorageBuffer;
        }
        else {
          pBVar13 = builder(this);
          local_7c = spv::Builder::makeAccelerationStructureType(pBVar13);
          pBVar13 = builder(this);
          local_7c = spv::Builder::makeRuntimeArray(pBVar13,local_7c);
          local_80 = StorageClassUniformConstant;
        }
      }
      else if (((itr._M_current)->info).descriptor_type == SSBO) {
        local_a8 = raw_component_type_to_type(((itr._M_current)->info).component);
        uVar6 = raw_component_type_to_bits(((itr._M_current)->info).component);
        RVar2 = local_a8;
        local_ac = uVar6;
        if ((((itr._M_current)->info).offsets & 1U) == 0) {
          uVar7 = raw_vecsize_to_vecsize(((itr._M_current)->info).raw_vecsize);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_f8,"SSBO",(ThreadLocalAllocator<char> *)((long)&cb + 7));
          local_7c = build_ssbo_runtime_array_type(this,RVar2,uVar6,uVar7,0xffffffff,&local_f8);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string(&local_f8);
        }
        else {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_d0,"SSBO_Offsets",&local_d1);
          local_7c = build_ssbo_runtime_array_type(this,RVar2,0x20,2,1,&local_d0);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string(&local_d0);
        }
        local_80 = StorageClassStorageBuffer;
        if (local_ac == 0x10) {
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer16BitAccess);
        }
        else if (local_ac == 8) {
          pBVar13 = builder(this);
          spv::Builder::addExtension(pBVar13,"SPV_KHR_8bit_storage");
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer8BitAccess);
        }
      }
      else {
        if (((((itr._M_current)->info).component != U32) &&
            (((itr._M_current)->info).component != I32)) &&
           (((itr._M_current)->info).component != F32)) {
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Invalid component type for image.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&uint_type,0x1000,"Invalid component type for image.\n");
            uVar3 = buffer._4088_8_;
            pvVar12 = get_thread_log_callback_userdata();
            (*(code *)uVar3)(pvVar12,2,&uint_type);
          }
          return 0;
        }
        uvec2_type = get_type_id(this,((itr._M_current)->info).component,1,1,false);
        pBVar13 = builder(this);
        IVar9 = uvec2_type;
        DVar8 = image_dimension_from_resource_kind(((itr._M_current)->info).kind);
        bVar4 = image_dimension_is_arrayed(((itr._M_current)->info).kind);
        bVar5 = image_dimension_is_multisampled(((itr._M_current)->info).kind);
        local_7c = spv::Builder::makeImageType
                             (pBVar13,IVar9,DVar8,false,bVar4,bVar5,1,ImageFormatUnknown);
        pBVar13 = builder(this);
        local_7c = spv::Builder::makeRuntimeArray(pBVar13,local_7c);
        local_80 = StorageClassUniformConstant;
      }
      break;
    case UAV:
      if ((((itr._M_current)->info).counters & 1U) == 0) {
        if (((itr._M_current)->info).descriptor_type == SSBO) {
          local_114c = raw_component_type_to_type(((itr._M_current)->info).component);
          uVar6 = raw_component_type_to_bits(((itr._M_current)->info).component);
          RVar2 = local_114c;
          local_1150 = uVar6;
          uVar7 = raw_vecsize_to_vecsize(((itr._M_current)->info).raw_vecsize);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_1170,"SSBO",(ThreadLocalAllocator<char> *)((long)&cb_1 + 7));
          local_7c = build_ssbo_runtime_array_type(this,RVar2,uVar6,uVar7,0xffffffff,&local_1170);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string(&local_1170);
          local_80 = StorageClassStorageBuffer;
          if (local_1150 == 0x10) {
            pBVar13 = builder(this);
            spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer16BitAccess);
          }
          else if (local_1150 == 8) {
            pBVar13 = builder(this);
            spv::Builder::addExtension(pBVar13,"SPV_KHR_8bit_storage");
            pBVar13 = builder(this);
            spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer8BitAccess);
          }
        }
        else {
          if ((((((itr._M_current)->info).component != U32) &&
               (((itr._M_current)->info).component != I32)) &&
              (((itr._M_current)->info).component != F32)) &&
             (((itr._M_current)->info).component != U64)) {
            p_Var11 = get_thread_log_callback();
            if (p_Var11 == (LoggingCallback)0x0) {
              fprintf(_stderr,"[ERROR]: Invalid component type for image.\n");
              fflush(_stderr);
            }
            else {
              snprintf((char *)&raw_type_2,0x1000,"Invalid component type for image.\n");
              pvVar12 = get_thread_log_callback_userdata();
              (*p_Var11)(pvVar12,Error,(char *)&raw_type_2);
            }
            return 0;
          }
          bits_2 = get_type_id(this,((itr._M_current)->info).component,1,1,false);
          pBVar13 = builder(this);
          uVar6 = bits_2;
          DVar8 = image_dimension_from_resource_kind(((itr._M_current)->info).kind);
          bVar4 = image_dimension_is_arrayed(((itr._M_current)->info).kind);
          bVar5 = image_dimension_is_multisampled(((itr._M_current)->info).kind);
          local_7c = spv::Builder::makeImageType
                               (pBVar13,uVar6,DVar8,false,bVar4,bVar5,2,
                                ((itr._M_current)->info).format);
          pBVar13 = builder(this);
          local_7c = spv::Builder::makeRuntimeArray(pBVar13,local_7c);
          local_80 = StorageClassUniformConstant;
        }
      }
      else {
        pBVar13 = builder(this);
        runtime_array_type_id = spv::Builder::makeUintType(pBVar13,0x20);
        pBVar13 = builder(this);
        local_1114 = spv::Builder::makeVectorType(pBVar13,runtime_array_type_id,2);
        pBVar13 = builder(this);
        local_1118 = spv::Builder::makeRuntimeArray(pBVar13,local_1114);
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,local_1118,DecorationArrayStride,8);
        raw_type_1 = local_1118;
        local_1140 = &raw_type_1;
        local_1138 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_1140;
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                  (&local_1130,__l_00,(allocator_type *)((long)&bits_1 + 3));
        local_7c = get_struct_type(this,&local_1130,0,"AtomicCounters");
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                  (&local_1130);
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,local_7c,DecorationBlock,-1);
        pBVar13 = builder(this);
        spv::Builder::addMemberName(pBVar13,local_7c,0,"counters");
        pBVar13 = builder(this);
        spv::Builder::addMemberDecoration(pBVar13,local_7c,0,DecorationOffset,0);
        pBVar13 = builder(this);
        spv::Builder::addMemberDecoration(pBVar13,local_7c,0,DecorationNonWritable,-1);
        local_80 = StorageClassStorageBuffer;
      }
      break;
    case CBV:
      vecsize = raw_component_type_to_type(((itr._M_current)->info).component);
      element_size = raw_component_type_to_bits(((itr._M_current)->info).component);
      num_elements = raw_vecsize_to_vecsize(((itr._M_current)->info).raw_vecsize);
      if (vecsize == 1) {
        pBVar13 = builder(this);
        local_2290 = spv::Builder::makeFloatType(pBVar13,element_size);
      }
      else {
        pBVar13 = builder(this);
        local_2290 = spv::Builder::makeUintType(pBVar13,element_size);
      }
      local_7c = local_2290;
      if (1 < num_elements) {
        pBVar13 = builder(this);
        local_7c = spv::Builder::makeVectorType(pBVar13,local_7c,num_elements);
      }
      local_219c = (element_size >> 3) * num_elements;
      local_21a0 = (uint)(0x10000 / (ulong)local_219c);
      pBVar13 = builder(this);
      IVar9 = local_7c;
      this_00 = builder(this);
      sizeId = spv::Builder::makeUintConstant(this_00,local_21a0,false);
      local_7c = spv::Builder::makeArrayType(pBVar13,IVar9,sizeId,local_219c);
      pBVar13 = builder(this);
      spv::Builder::addDecoration(pBVar13,local_7c,DecorationArrayStride,local_219c);
      meta._4_4_ = local_7c;
      local_21c8 = (iterator)((long)&meta + 4);
      local_21c0 = 1;
      __l._M_len = 1;
      __l._M_array = local_21c8;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_21b8,__l,(allocator_type *)((long)&meta + 3));
      local_7c = get_struct_type(this,&local_21b8,0,"BindlessCBV");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_21b8)
      ;
      pBVar13 = builder(this);
      spv::Builder::addDecoration(pBVar13,local_7c,DecorationBlock,-1);
      if (((this->options).bindless_cbv_ssbo_emulation & 1U) != 0) {
        pBVar13 = builder(this);
        spv::Builder::addMemberDecoration(pBVar13,local_7c,0,DecorationNonWritable,-1);
      }
      pBVar13 = builder(this);
      spv::Builder::addMemberDecoration(pBVar13,local_7c,0,DecorationOffset,0);
      pBVar13 = builder(this);
      local_7c = spv::Builder::makeRuntimeArray(pBVar13,local_7c);
      local_80 = StorageClassUniform;
      if (((this->options).bindless_cbv_ssbo_emulation & 1U) != 0) {
        local_80 = StorageClassStorageBuffer;
      }
      if (element_size == 0x10) {
        if (((this->options).bindless_cbv_ssbo_emulation & 1U) == 0) {
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityStorageUniform16);
        }
        else {
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer16BitAccess);
        }
      }
      else if (element_size == 8) {
        pBVar13 = builder(this);
        spv::Builder::addExtension(pBVar13,"SPV_KHR_8bit_storage");
        if (((this->options).bindless_cbv_ssbo_emulation & 1U) == 0) {
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityUniformAndStorageBuffer8BitAccess);
        }
        else {
          pBVar13 = builder(this);
          spv::Builder::addCapability(pBVar13,CapabilityStorageBuffer8BitAccess);
        }
      }
      break;
    case Sampler:
      pBVar13 = builder(this);
      local_7c = spv::Builder::makeSamplerType(pBVar13);
      pBVar13 = builder(this);
      local_7c = spv::Builder::makeRuntimeArray(pBVar13,local_7c);
      local_80 = StorageClassUniformConstant;
      break;
    default:
      return 0;
    }
    pBVar13 = builder(this);
    spv::Builder::addExtension(pBVar13,"SPV_EXT_descriptor_indexing");
    pBVar13 = builder(this);
    spv::Builder::addCapability(pBVar13,CapabilityRuntimeDescriptorArray);
    IVar9 = create_variable(this,local_80,local_7c,(char *)0x0);
    resource.info.desc_set = IVar9;
    local_21d8 = std::
                 unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                 ::operator[](&this->handle_to_resource_meta,&resource.info.desc_set);
    local_2228.kind = Invalid;
    local_2228.component_type = Invalid;
    local_2228.raw_component_vecsize = V1;
    local_2228.stride = 0;
    local_2228.var_id = 0;
    memset(&local_2228.var_alias_group,0,0x18);
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::vector(&local_2228.var_alias_group);
    local_2228.aliased = false;
    local_2228.non_uniform = false;
    local_2228.counter_is_physical_pointer = false;
    local_2228.rov = false;
    local_2228.storage = StorageClassUniformConstant;
    local_2228.counter_var_id = 0;
    local_2228.physical_pointer_meta.nonwritable = false;
    local_2228.physical_pointer_meta.nonreadable = false;
    local_2228.physical_pointer_meta.coherent = false;
    local_2228.physical_pointer_meta.rov = false;
    local_2228.physical_pointer_meta.stride = '\0';
    local_2228.physical_pointer_meta.size = 0;
    local_2228.index_offset_id = 0;
    local_2228.instrumentation.bda_id = 0;
    local_2228.instrumentation.elem_size_id = 0;
    local_2228.instrumentation.resource_size_id = 0;
    ResourceMeta::operator=(local_21d8,&local_2228);
    ResourceMeta::~ResourceMeta(&local_2228);
    local_21d8->kind = ((itr._M_current)->info).kind;
    local_21d8->component_type = ((itr._M_current)->info).component;
    local_21d8->raw_component_vecsize = ((itr._M_current)->info).raw_vecsize;
    local_21d8->var_id = resource.info.desc_set;
    local_21d8->storage = local_80;
    pBVar13 = builder(this);
    spv::Builder::addDecoration
              (pBVar13,resource.info.desc_set,DecorationDescriptorSet,
               ((itr._M_current)->info).desc_set);
    pBVar13 = builder(this);
    spv::Builder::addDecoration
              (pBVar13,resource.info.desc_set,DecorationBinding,((itr._M_current)->info).binding);
    if ((((itr._M_current)->info).relaxed_precision & 1U) != 0) {
      pBVar13 = builder(this);
      spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationRelaxedPrecision,-1);
      CVar1 = local_21d8->component_type;
      if (CVar1 == I32) {
        local_21d8->component_type = I16;
      }
      else if (CVar1 == U32) {
        local_21d8->component_type = U16;
      }
      else if (CVar1 == F32) {
        local_21d8->component_type = F16;
      }
    }
    if ((((itr._M_current)->info).type == UAV) && ((((itr._M_current)->info).counters & 1U) == 0)) {
      if ((((itr._M_current)->info).uav_read & 1U) == 0) {
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationNonReadable,-1);
      }
      if ((((itr._M_current)->info).uav_written & 1U) == 0) {
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationNonWritable,-1);
      }
      if ((((itr._M_current)->info).uav_coherent & 1U) != 0) {
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationCoherent,-1);
      }
    }
    else if ((((itr._M_current)->info).counters & 1U) == 0) {
      if ((((itr._M_current)->info).type == SRV) &&
         (((itr._M_current)->info).descriptor_type == SSBO)) {
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationNonWritable,-1);
        pBVar13 = builder(this);
        spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationRestrict,-1);
      }
    }
    else {
      pBVar13 = builder(this);
      spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationAliasedPointer,-1);
    }
    if (((((itr._M_current)->info).aliased & 1U) != 0) && (((itr._M_current)->info).type == UAV)) {
      pBVar13 = builder(this);
      spv::Builder::addDecoration(pBVar13,resource.info.desc_set,DecorationAliased,-1);
    }
    std::
    vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
    ::push_back(&this->bindless_resources,(value_type *)&storage);
    this_local._4_4_ = resource.info.desc_set;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::create_bindless_heap_variable(const BindlessInfo &info)
{
	auto itr = std::find_if(bindless_resources.begin(), bindless_resources.end(), [&](const BindlessResource &resource) {
		return
			resource.info.type == info.type &&
			resource.info.component == info.component &&
			resource.info.raw_vecsize == info.raw_vecsize &&
			resource.info.kind == info.kind &&
			resource.info.desc_set == info.desc_set &&
			resource.info.format == info.format &&
			resource.info.binding == info.binding &&
			resource.info.uav_read == info.uav_read &&
			resource.info.uav_written == info.uav_written &&
			resource.info.uav_coherent == info.uav_coherent &&
			resource.info.relaxed_precision == info.relaxed_precision &&
			resource.info.aliased == info.aliased &&
			resource.info.counters == info.counters &&
			resource.info.offsets == info.offsets &&
			resource.info.descriptor_type == info.descriptor_type;
	});

	if (itr != bindless_resources.end())
	{
		return itr->var_id;
	}
	else
	{
		BindlessResource resource = {};
		resource.info = info;

		spv::Id type_id = 0;
		auto storage = spv::StorageClassMax;

		switch (info.type)
		{
		case DXIL::ResourceType::SRV:
		{
			if (info.kind == DXIL::ResourceKind::RTAccelerationStructure)
			{
				if (info.descriptor_type == VulkanDescriptorType::SSBO)
				{
					type_id = build_ssbo_runtime_array_type(*this, RawType::Integer, 32, 2, 1, "RTASHeap");
					storage = spv::StorageClassStorageBuffer;
				}
				else
				{
					type_id = builder().makeAccelerationStructureType();
					type_id = builder().makeRuntimeArray(type_id);
					storage = spv::StorageClassUniformConstant;
				}
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				if (info.offsets)
					type_id = build_ssbo_runtime_array_type(*this, raw_type, 32, 2, 1, "SSBO_Offsets");
				else
					type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
					                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 1, spv::ImageFormatUnknown);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::UAV:
		{
			if (info.counters)
			{
				spv::Id uint_type = builder().makeUintType(32);
				spv::Id uvec2_type = builder().makeVectorType(uint_type, 2);

				spv::Id runtime_array_type_id = builder().makeRuntimeArray(uvec2_type);
				builder().addDecoration(runtime_array_type_id, spv::DecorationArrayStride, sizeof(uint64_t));

				type_id = get_struct_type({ runtime_array_type_id }, 0, "AtomicCounters");
				builder().addDecoration(type_id, spv::DecorationBlock);
				builder().addMemberName(type_id, 0, "counters");
				builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
				storage = spv::StorageClassStorageBuffer;
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
				                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32 &&
				    info.component != DXIL::ComponentType::U64)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 2, info.format);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::Sampler:
			type_id = builder().makeSamplerType();
			type_id = builder().makeRuntimeArray(type_id);
			storage = spv::StorageClassUniformConstant;
			break;

		case DXIL::ResourceType::CBV:
		{
			RawType raw_type = raw_component_type_to_type(info.component);
			unsigned bits = raw_component_type_to_bits(info.component);

			unsigned vecsize = raw_vecsize_to_vecsize(info.raw_vecsize);
			type_id = raw_type == RawType::Float ? builder().makeFloatType(bits) : builder().makeUintType(bits);
			if (vecsize > 1)
				type_id = builder().makeVectorType(type_id, vecsize);

			unsigned element_size = (bits / 8) * vecsize;
			unsigned num_elements = 0x10000 / element_size;

			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(num_elements), element_size);
			builder().addDecoration(type_id, spv::DecorationArrayStride, element_size);
			type_id = get_struct_type({ type_id }, 0, "BindlessCBV");
			builder().addDecoration(type_id, spv::DecorationBlock);
			if (options.bindless_cbv_ssbo_emulation)
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
			builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
			type_id = builder().makeRuntimeArray(type_id);
			storage = options.bindless_cbv_ssbo_emulation ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;

			if (bits == 16)
			{
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer16BitAccess);
			}
			else if (bits == 8)
			{
				builder().addExtension("SPV_KHR_8bit_storage");
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer8BitAccess);
			}
			break;
		}

		default:
			return 0;
		}

		builder().addExtension("SPV_EXT_descriptor_indexing");
		builder().addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
		resource.var_id = create_variable(storage, type_id);

		auto &meta = handle_to_resource_meta[resource.var_id];
		meta = {};
		meta.kind = info.kind;
		meta.component_type = info.component;
		meta.raw_component_vecsize = info.raw_vecsize;
		meta.var_id = resource.var_id;
		meta.storage = storage;

		builder().addDecoration(resource.var_id, spv::DecorationDescriptorSet, info.desc_set);
		builder().addDecoration(resource.var_id, spv::DecorationBinding, info.binding);

		if (info.relaxed_precision)
		{
			builder().addDecoration(resource.var_id, spv::DecorationRelaxedPrecision);

			// Signal the intended component type.
			switch (meta.component_type)
			{
			case DXIL::ComponentType::F32:
				meta.component_type = DXIL::ComponentType::F16;
				break;

			case DXIL::ComponentType::I32:
				meta.component_type = DXIL::ComponentType::I16;
				break;

			case DXIL::ComponentType::U32:
				meta.component_type = DXIL::ComponentType::U16;
				break;

			default:
				break;
			}
		}

		if (info.type == DXIL::ResourceType::UAV && !info.counters)
		{
			if (!info.uav_read)
				builder().addDecoration(resource.var_id, spv::DecorationNonReadable);
			if (!info.uav_written)
				builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			if (info.uav_coherent)
				builder().addDecoration(resource.var_id, spv::DecorationCoherent);
		}
		else if (info.counters)
		{
			builder().addDecoration(resource.var_id, spv::DecorationAliasedPointer);
		}
		else if (info.type == DXIL::ResourceType::SRV && info.descriptor_type == VulkanDescriptorType::SSBO)
		{
			builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			builder().addDecoration(resource.var_id, spv::DecorationRestrict);
		}

		// The default in Vulkan environment is Restrict.
		if (info.aliased && info.type == DXIL::ResourceType::UAV)
			builder().addDecoration(resource.var_id, spv::DecorationAliased);

		bindless_resources.push_back(resource);
		return resource.var_id;
	}
}